

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fkParentIsModified(Table *pTab,FKey *p,int *aChange,int bChngRowid)

{
  char *zRight;
  int iVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar3 = (ulong)(uint)p->nCol;
  if (p->nCol < 1) {
    uVar3 = 0;
  }
  uVar4 = 0;
  do {
    if (uVar4 == uVar3) {
      return 0;
    }
    uVar2 = pTab->nCol;
    if ((short)uVar2 < 1) {
      uVar2 = 0;
    }
    zRight = p->aCol[uVar4].zCol;
    lVar6 = 0;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      if ((-1 < aChange[uVar5]) || ((bChngRowid != 0 && (uVar5 == (uint)(int)pTab->iPKey)))) {
        if (zRight == (char *)0x0) {
          if (((&pTab->aCol->colFlags)[lVar6] & 1) != 0) {
            return 1;
          }
        }
        else {
          iVar1 = sqlite3StrICmp(*(char **)((long)&pTab->aCol->zName + lVar6),zRight);
          if (iVar1 == 0) {
            return 1;
          }
        }
      }
      lVar6 = lVar6 + 0x20;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static int fkParentIsModified(
  Table *pTab, 
  FKey *p, 
  int *aChange, 
  int bChngRowid
){
  int i;
  for(i=0; i<p->nCol; i++){
    char *zKey = p->aCol[i].zCol;
    int iKey;
    for(iKey=0; iKey<pTab->nCol; iKey++){
      if( aChange[iKey]>=0 || (iKey==pTab->iPKey && bChngRowid) ){
        Column *pCol = &pTab->aCol[iKey];
        if( zKey ){
          if( 0==sqlite3StrICmp(pCol->zName, zKey) ) return 1;
        }else if( pCol->colFlags & COLFLAG_PRIMKEY ){
          return 1;
        }
      }
    }
  }
  return 0;
}